

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_qmfb.c
# Opt level: O2

int jpc_ft_synthesize(jpc_fix_t *a,int xstart,int ystart,int width,int height,int stride)

{
  ulong *puVar1;
  ulong uVar2;
  jpc_fix_t *pjVar3;
  jpc_fix_t *pjVar4;
  ulong *puVar5;
  jpc_fix_t *pjVar6;
  jpc_fix_t *pjVar7;
  uint uVar8;
  jpc_fix_t *pjVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  jpc_fix_t *pjVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  jpc_fix_t *pjVar18;
  uint parity;
  int iVar19;
  jpc_fix_t *pjVar20;
  ulong uVar21;
  ulong *a_00;
  jpc_fix_t *pjVar22;
  bool bVar23;
  uint local_88;
  uint local_80;
  uint local_78;
  
  uVar10 = xstart & 1;
  uVar8 = (uVar10 ^ 1) + width >> 1;
  local_80 = width & 1;
  bVar23 = (width & 1U) == uVar10;
  pjVar7 = a + uVar8;
  local_78 = xstart & 1;
  a_00 = (ulong *)a;
  for (iVar19 = 0; iVar19 != height; iVar19 = iVar19 + 1) {
    if ((uint)width < 2) {
      if (local_78 != 0) {
        *a_00 = (long)(int)(*a_00 >> 1);
      }
    }
    else {
      puVar1 = a_00 + uVar8;
      puVar5 = a_00;
      if (local_78 == 0) {
        *a_00 = *a_00 - ((long)(*puVar1 * 0x80000000 + 0x80000000) >> 0x20);
        puVar5 = a_00 + 1;
      }
      for (lVar16 = 0; (!bVar23 - uVar8) + (uint)(uVar10 == 0) + (int)lVar16 != 0;
          lVar16 = lVar16 + 1) {
        puVar5[lVar16] =
             puVar5[lVar16] -
             ((pjVar7[lVar16 + 1] + pjVar7[lVar16]) * 0x40000000 + 0x80000000 >> 0x20);
      }
      if (local_80 != local_78) {
        puVar5[lVar16] = puVar5[lVar16] - (pjVar7[lVar16] * 0x80000000 + 0x80000000 >> 0x20);
      }
      if (local_78 != 0) {
        *puVar1 = *puVar1 + *a_00;
        puVar1 = puVar1 + 1;
      }
      for (lVar16 = 0; ((width - (uint)bVar23) - uVar8) - uVar10 != (int)lVar16; lVar16 = lVar16 + 1
          ) {
        puVar1[lVar16] = puVar1[lVar16] + (long)(int)(a_00[lVar16 + 1] + a_00[lVar16] >> 1);
      }
      if (local_80 == local_78) {
        puVar1[lVar16] = puVar1[lVar16] + a_00[lVar16];
      }
    }
    jpc_qmfb_join_row((jpc_fix_t *)a_00,width,local_78);
    a_00 = a_00 + stride;
    pjVar7 = pjVar7 + stride;
  }
  parity = ystart & 1;
  local_88 = width & 0xfffffff0;
  uVar8 = (height - parity) + 1 >> 1;
  uVar21 = (ulong)(uVar8 * stride);
  uVar10 = (uint)((ystart & 1U) == 0);
  uVar11 = height & 1;
  uVar17 = (uint)(uVar11 != parity);
  uVar12 = (uint)(uVar11 == parity);
  iVar19 = (height - (uVar8 + parity)) - uVar12;
  uVar2 = (ulong)((((byte)((char)ystart + 1) & 1) + height >> 1) * stride);
  pjVar7 = a + uVar2;
  pjVar20 = a + (uint)stride + uVar2;
  pjVar4 = a + (uint)stride + uVar21;
  pjVar22 = a + (uint)stride;
  pjVar14 = a + uVar21;
  for (uVar15 = 0; uVar15 < local_88; uVar15 = uVar15 + 0x10) {
    if ((uint)height < 2) {
      if ((ystart & 1U) != 0) {
        for (lVar16 = 0; (int)lVar16 != 0x10; lVar16 = lVar16 + 1) {
          a[lVar16] = (long)(int)((ulong)a[lVar16] >> 1);
        }
      }
    }
    else {
      pjVar6 = a;
      if ((ystart & 1U) == 0) {
        for (lVar16 = 0; (int)lVar16 != 0x10; lVar16 = lVar16 + 1) {
          a[lVar16] = a[lVar16] - (a[uVar21 + lVar16] * 0x80000000 + 0x80000000 >> 0x20);
        }
        pjVar6 = a + (uint)stride;
      }
      pjVar3 = a + uVar21;
      pjVar9 = pjVar14;
      pjVar18 = pjVar4;
      iVar13 = (uVar8 - uVar10) - uVar17;
      while (bVar23 = iVar13 != 0, iVar13 = iVar13 + -1, bVar23) {
        for (lVar16 = 0; (int)lVar16 != 0x10; lVar16 = lVar16 + 1) {
          pjVar6[lVar16] =
               pjVar6[lVar16] -
               ((pjVar18[lVar16] + pjVar9[lVar16]) * 0x40000000 + 0x80000000 >> 0x20);
        }
        pjVar6 = pjVar6 + (uint)stride;
        pjVar9 = pjVar9 + (uint)stride;
        pjVar18 = pjVar18 + (uint)stride;
      }
      if (uVar11 != parity) {
        for (lVar16 = 0; (int)lVar16 != 0x10; lVar16 = lVar16 + 1) {
          pjVar6[lVar16] = pjVar6[lVar16] - (pjVar9[lVar16] * 0x80000000 + 0x80000000 >> 0x20);
        }
      }
      pjVar6 = a;
      pjVar9 = pjVar22;
      iVar13 = iVar19;
      if ((ystart & 1U) != 0) {
        for (lVar16 = 0; (int)lVar16 != 0x10; lVar16 = lVar16 + 1) {
          a[uVar21 + lVar16] = a[uVar21 + lVar16] + a[lVar16];
        }
        pjVar3 = pjVar3 + (uint)stride;
      }
      while (iVar13 != 0) {
        for (lVar16 = 0; (int)lVar16 != 0x10; lVar16 = lVar16 + 1) {
          pjVar3[lVar16] =
               pjVar3[lVar16] + (long)(int)((ulong)(pjVar9[lVar16] + pjVar6[lVar16]) >> 1);
        }
        pjVar3 = pjVar3 + (uint)stride;
        pjVar6 = pjVar6 + (uint)stride;
        pjVar9 = pjVar9 + (uint)stride;
        iVar13 = iVar13 + -1;
      }
      if (uVar11 == parity) {
        for (lVar16 = 0; (int)lVar16 != 0x10; lVar16 = lVar16 + 1) {
          pjVar3[lVar16] = pjVar3[lVar16] + pjVar6[lVar16];
        }
      }
    }
    jpc_qmfb_join_colgrp(a,height,stride,parity);
    a = a + 0x10;
    pjVar22 = pjVar22 + 0x10;
    pjVar7 = pjVar7 + 0x10;
    pjVar20 = pjVar20 + 0x10;
    pjVar4 = pjVar4 + 0x10;
    pjVar14 = pjVar14 + 0x10;
  }
  if (local_88 != width) {
    uVar8 = width & 0xf;
    if ((uint)height < 2) {
      if ((ystart & 1U) != 0) {
        for (lVar16 = 0; uVar8 != (uint)lVar16; lVar16 = lVar16 + 1) {
          a[lVar16] = (long)(int)((ulong)a[lVar16] >> 1);
        }
      }
    }
    else {
      uVar15 = (parity ^ 1) + height >> 1;
      pjVar14 = a;
      if ((ystart & 1U) == 0) {
        for (lVar16 = 0; uVar8 != (uint)lVar16; lVar16 = lVar16 + 1) {
          a[lVar16] = a[lVar16] - (a[uVar2 + lVar16] * 0x80000000 + 0x80000000 >> 0x20);
        }
        pjVar14 = a + (uint)stride;
      }
      pjVar4 = a + uVar15 * stride;
      iVar19 = (uVar15 - uVar10) - uVar17;
      while (bVar23 = iVar19 != 0, iVar19 = iVar19 + -1, bVar23) {
        for (lVar16 = 0; uVar8 != (uint)lVar16; lVar16 = lVar16 + 1) {
          pjVar14[lVar16] =
               pjVar14[lVar16] -
               ((pjVar20[lVar16] + pjVar7[lVar16]) * 0x40000000 + 0x80000000 >> 0x20);
        }
        pjVar14 = pjVar14 + (uint)stride;
        pjVar7 = pjVar7 + (uint)stride;
        pjVar20 = pjVar20 + (uint)stride;
      }
      if (uVar11 != parity) {
        for (lVar16 = 0; uVar8 != (uint)lVar16; lVar16 = lVar16 + 1) {
          pjVar14[lVar16] = pjVar14[lVar16] - (pjVar7[lVar16] * 0x80000000 + 0x80000000 >> 0x20);
        }
      }
      if ((ystart & 1U) != 0) {
        for (lVar16 = 0; uVar8 != (uint)lVar16; lVar16 = lVar16 + 1) {
          a[(ulong)(uVar15 * stride) + lVar16] = a[(ulong)(uVar15 * stride) + lVar16] + a[lVar16];
        }
        pjVar4 = pjVar4 + (uint)stride;
      }
      iVar19 = (height - (uVar15 + parity)) - uVar12;
      pjVar7 = a;
      while (bVar23 = iVar19 != 0, iVar19 = iVar19 + -1, bVar23) {
        for (lVar16 = 0; uVar8 != (uint)lVar16; lVar16 = lVar16 + 1) {
          pjVar4[lVar16] =
               pjVar4[lVar16] + (long)(int)((ulong)(pjVar22[lVar16] + pjVar7[lVar16]) >> 1);
        }
        pjVar7 = pjVar7 + (uint)stride;
        pjVar4 = pjVar4 + (uint)stride;
        pjVar22 = pjVar22 + (uint)stride;
      }
      if (uVar11 == parity) {
        for (lVar16 = 0; uVar8 != (uint)lVar16; lVar16 = lVar16 + 1) {
          pjVar4[lVar16] = pjVar4[lVar16] + pjVar7[lVar16];
        }
      }
    }
    jpc_qmfb_join_colres(a,height,uVar8,stride,parity);
  }
  return 0;
}

Assistant:

int jpc_ft_synthesize(jpc_fix_t *a, int xstart, int ystart, int width, int height,
  int stride)
{
	const unsigned numrows = height;
	const unsigned numcols = width;
	const unsigned rowparity = ystart & 1;
	const unsigned colparity = xstart & 1;

	jpc_fix_t *startptr;

	startptr = &a[0];
	for (unsigned i = 0; i < numrows; ++i) {
		jpc_ft_invlift_row(startptr, numcols, colparity);
		jpc_qmfb_join_row(startptr, numcols, colparity);
		startptr += stride;
	}

	const unsigned maxcols = (numcols / JPC_QMFB_COLGRPSIZE) * JPC_QMFB_COLGRPSIZE;
	startptr = &a[0];
	for (unsigned i = 0; i < maxcols; i += JPC_QMFB_COLGRPSIZE) {
		jpc_ft_invlift_colgrp(startptr, numrows, stride, rowparity);
		jpc_qmfb_join_colgrp(startptr, numrows, stride, rowparity);
		startptr += JPC_QMFB_COLGRPSIZE;
	}
	if (maxcols < numcols) {
		jpc_ft_invlift_colres(startptr, numrows, numcols - maxcols, stride,
		  rowparity);
		jpc_qmfb_join_colres(startptr, numrows, numcols - maxcols, stride,
		  rowparity);
	}

	return 0;

}